

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O3

int i2c_ASN1_BIT_STRING(ASN1_BIT_STRING *a,uchar **pp)

{
  byte *pbVar1;
  uint uVar2;
  undefined8 in_RAX;
  int iVar3;
  uint8_t bits;
  byte local_31;
  
  local_31 = (byte)((ulong)in_RAX >> 0x38);
  if (a == (ASN1_BIT_STRING *)0x0) {
    iVar3 = 0;
  }
  else {
    uVar2 = asn1_bit_string_length((ASN1_BIT_STRING *)a,&local_31);
    if (uVar2 == 0x7fffffff) {
      iVar3 = 0;
      ERR_put_error(0xc,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                    ,0x4f);
    }
    else {
      iVar3 = uVar2 + 1;
      if (pp != (uchar **)0x0) {
        pbVar1 = *pp;
        *pbVar1 = local_31;
        if (uVar2 != 0) {
          memcpy(pbVar1 + 1,a->data,(long)(int)uVar2);
          if (0 < (int)uVar2) {
            pbVar1[uVar2] = pbVar1[uVar2] & (byte)(0xff << (local_31 & 0x1f));
          }
        }
        *pp = pbVar1 + 1 + (int)uVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int i2c_ASN1_BIT_STRING(const ASN1_BIT_STRING *a, unsigned char **pp) {
  if (a == NULL) {
    return 0;
  }

  uint8_t bits;
  int len = asn1_bit_string_length(a, &bits);
  if (len > INT_MAX - 1) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_OVERFLOW);
    return 0;
  }
  int ret = 1 + len;
  if (pp == NULL) {
    return ret;
  }

  uint8_t *p = *pp;
  *(p++) = bits;
  OPENSSL_memcpy(p, a->data, len);
  if (len > 0) {
    p[len - 1] &= (0xff << bits);
  }
  p += len;
  *pp = p;
  return ret;
}